

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdatetimeedit.cpp
# Opt level: O0

void QDateEdit::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  qint64 *pqVar2;
  bool bVar3;
  QtMocHelpers *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QDateEdit *_t;
  QDate in_stack_ffffffffffffff98;
  QDateTimeEdit *in_stack_ffffffffffffffb8;
  QDate in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_ESI == 0) && (in_EDX == 0)) {
    userDateChanged((QDateEdit *)0x5637e3,in_stack_ffffffffffffff98);
  }
  if (in_ESI == 5) {
    in_stack_ffffffffffffffb8 = (QDateTimeEdit *)0x0;
    bVar3 = QtMocHelpers::indexOfMethod<void(QDateEdit::*)(QDate)>
                      (in_RCX,(void **)userDateChanged,0,0);
    if (bVar3) goto LAB_005638a8;
  }
  if ((in_ESI == 1) && (pqVar2 = *(qint64 **)in_RCX, in_EDX == 0)) {
    in_stack_ffffffffffffffe8 = QDateTimeEdit::date(in_stack_ffffffffffffff98.jd);
    *pqVar2 = in_stack_ffffffffffffffe8.jd;
  }
  if ((in_ESI == 2) && (in_EDX == 0)) {
    QDateTimeEdit::setDate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffe8);
  }
LAB_005638a8:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDateEdit::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDateEdit *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->userDateChanged((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDateEdit::*)(QDate )>(_a, &QDateEdit::userDateChanged, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QDate*>(_v) = _t->date(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setDate(*reinterpret_cast<QDate*>(_v)); break;
        default: break;
        }
    }
}